

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

span<const_slang::SourceLibrary_*,_18446744073709551615UL> __thiscall
slang::BumpAllocator::copyFrom<slang::SourceLibrary_const*>
          (BumpAllocator *this,span<const_slang::SourceLibrary_*const,_18446744073709551615UL> src)

{
  pointer __dest;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> sVar1;
  
  sVar1._M_extent = src._M_extent._M_extent_value;
  if (sVar1._M_extent._M_extent_value == 0) {
    __dest = (pointer)0x0;
  }
  else {
    __dest = (pointer)allocate(this,sVar1._M_extent._M_extent_value * 8,8);
    memcpy(__dest,src._M_ptr,sVar1._M_extent._M_extent_value * 8);
  }
  sVar1._M_ptr = __dest;
  return sVar1;
}

Assistant:

[[nodiscard]] std::span<T> copyFrom(std::span<const T> src) {
        auto len = src.size();
        if (len == 0)
            return {};

        auto dest = reinterpret_cast<T*>(allocate(len * sizeof(T), alignof(T)));
        std::memcpy(dest, src.data(), len * sizeof(T));

        return std::span<T>(dest, len);
    }